

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::AddProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  int *piVar1;
  BOOL BVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  
  if (attributes < 0x10) {
    BVar2 = AddPropertyInternal(this,instance,propertyId,value,attributes,info,flags,
                                possibleSideEffects);
    return BVar2;
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryAttributesCount
  ;
  *piVar1 = *piVar1 + 1;
  pDVar4 = TryConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>>
                     (this,instance,((this->super_DynamicTypeHandler).unusedBytes >> 1) + 1,false);
  iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x3a])
                    (pDVar4,instance,(ulong)(uint)propertyId,value,(ulong)attributes,info);
  return iVar3;
}

Assistant:

BOOL PathTypeHandlerBase::AddProperty(DynamicObject * instance, PropertyId propertyId, Js::Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (!ObjectSlotAttributesContains(attributes))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif
            // Setting an attribute that PathTypeHandler can't express
            return TryConvertToSimpleDictionaryType(instance, GetPathLength() + 1)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }
        return AddPropertyInternal(instance, propertyId, value, PropertyAttributesToObjectSlotAttributes(attributes), info, flags, possibleSideEffects);
    }